

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::Reg2Int1(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,int C1)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R0_00;
  RegSlot R1_00;
  undefined4 *puVar3;
  OpCode op_00;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x47);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x989,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007d068d;
    *puVar3 = 0;
  }
  bVar2 = DoDynamicProfileOpcode(this,CheckThisPhase,false);
  if ((((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,TypedArrayTypeSpecPhase,false), bVar2)) ||
      (bVar2 = DoDynamicProfileOpcode(this,ArrayCheckHoistPhase,false), op_00 = op, bVar2)) &&
     (op_00 = ProfiledLdThis, op != LdThis)) {
    op_00 = op;
  }
  R0_00 = ConsumeReg(this,R0);
  R1_00 = ConsumeReg(this,R1);
  bVar2 = TryWriteReg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op_00,R0_00,R1_00,C1);
  if (((!bVar2) &&
      (bVar2 = TryWriteReg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op_00,R0_00,R1_00,C1),
      !bVar2)) &&
     (bVar2 = TryWriteReg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,op_00,R0_00,R1_00,C1),
     !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x998,"(success)","success");
    if (!bVar2) {
LAB_007d068d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg2Int1(OpCode op, RegSlot R0, RegSlot R1, int C1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg2Int1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        if (DoDynamicProfileOpcode(CheckThisPhase) ||
            DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
            DoDynamicProfileOpcode(ArrayCheckHoistPhase))
        {
            if (op == OpCode::LdThis)
            {
                op = OpCode::ProfiledLdThis;
            }
        }

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(Reg2Int1, op, R0, R1, C1);
    }